

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O1

SUNErrCode
SUNMemoryHelper_Alloc_Sys
          (SUNMemoryHelper helper,SUNMemory *memptr,size_t mem_size,SUNMemoryType mem_type,
          void *queue)

{
  long *plVar1;
  SUNMemory pSVar2;
  void *pvVar3;
  ulong uVar4;
  
  pSVar2 = (SUNMemory)SUNMemoryNewEmpty(helper->sunctx);
  pSVar2->ptr = (void *)0x0;
  pSVar2->own = 1;
  pSVar2->type = mem_type;
  pSVar2->bytes = mem_size;
  if (mem_type == SUNMEMTYPE_HOST) {
    pvVar3 = malloc(mem_size);
    pSVar2->ptr = pvVar3;
    plVar1 = (long *)helper->content;
    uVar4 = mem_size + plVar1[2];
    plVar1[2] = uVar4;
    *plVar1 = *plVar1 + 1;
    if (uVar4 <= (ulong)plVar1[3]) {
      uVar4 = plVar1[3];
    }
    plVar1[3] = uVar4;
  }
  *memptr = pSVar2;
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_Alloc_Sys(SUNMemoryHelper helper, SUNMemory* memptr,
                                     size_t mem_size, SUNMemoryType mem_type,
                                     SUNDIALS_MAYBE_UNUSED void* queue)
{
  SUNFunctionBegin(helper->sunctx);

  SUNAssert(mem_type == SUNMEMTYPE_HOST, SUN_ERR_ARG_INCOMPATIBLE);

  SUNMemory mem = SUNMemoryNewEmpty(helper->sunctx);
  SUNCheckLastErr();

  mem->ptr   = NULL;
  mem->own   = SUNTRUE;
  mem->type  = mem_type;
  mem->bytes = mem_size;

  if (mem_type == SUNMEMTYPE_HOST)
  {
    mem->ptr = malloc(mem_size);
    SUNAssert(mem->ptr, SUN_ERR_MALLOC_FAIL);
    SUNHELPER_CONTENT(helper)->bytes_allocated += mem_size;
    SUNHELPER_CONTENT(helper)->num_allocations++;
    SUNHELPER_CONTENT(helper)->bytes_high_watermark =
      SUNMAX(SUNHELPER_CONTENT(helper)->bytes_allocated,
             SUNHELPER_CONTENT(helper)->bytes_high_watermark);
  }

  *memptr = mem;
  return SUN_SUCCESS;
}